

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O1

Gia_Man_t * Gia_ManMapShrink6(Gia_Man_t *p,int nFanoutMax,int fKeepLevel,int fVerbose)

{
  Shr_Fan_t *pSVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  Shr_Man_t *p_01;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  long lVar9;
  word wVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  byte bVar13;
  ulong uVar14;
  int *piVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  word *pwVar22;
  ulong uVar23;
  timespec ts;
  word uTruth1;
  word uTruth0;
  uint local_b0;
  uint local_ac;
  timespec local_88;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  Gia_Man_t *local_68;
  long local_60;
  long local_58;
  word local_50;
  long local_48;
  word local_40;
  ulong local_38;
  
  local_78 = fVerbose;
  iVar4 = clock_gettime(3,&local_88);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    local_60 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                  ,0x19a,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
  }
  p_01 = Shr_ManAlloc(p);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  local_ac = 0;
  local_b0 = 0;
  if (1 < p->nObjs) {
    lVar17 = 1;
    local_b0 = 0;
    local_ac = 0;
    local_68 = p;
    do {
      pGVar3 = p->pObjs + lVar17;
      uVar6 = (uint)*(ulong *)pGVar3;
      if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
        pGVar12 = p_01->pNew;
        pGVar7 = Gia_ManAppendObj(pGVar12);
        uVar8 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar8 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pGVar12->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = pGVar12->pObjs;
        if ((pGVar7 < pGVar2) || (pGVar2 + pGVar12->nObjs <= pGVar7)) {
LAB_007b5bff:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pGVar12->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = pGVar12->pObjs;
        if ((pGVar7 < pGVar2) || (pGVar2 + pGVar12->nObjs <= pGVar7)) goto LAB_007b5bff;
        iVar4 = (int)((long)pGVar7 - (long)pGVar2 >> 2);
        uVar6 = iVar4 * -0x55555555;
        uVar16 = iVar4 * 0x55555556;
        pGVar3->Value = uVar16;
        pVVar11 = p->vLevels;
        if (pVVar11 != (Vec_Int_t *)0x0) {
          if ((int)uVar16 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          pGVar12 = p_01->pNew;
          if (pGVar12->nObjs <= (int)(uVar6 & 0x7fffffff)) {
LAB_007b5be0:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar2 = p->pObjs;
          if ((pGVar3 < pGVar2) || (pGVar2 + p->nObjs <= pGVar3)) goto LAB_007b5bff;
          pGVar7 = pGVar12->pObjs + (uVar6 & 0x7fffffff);
          uVar6 = (int)((long)pGVar3 - (long)pGVar2 >> 2) * -0x55555555;
          Vec_IntFillExtra(pVVar11,uVar6 + 1,uVar6);
          if (((int)uVar6 < 0) || (pVVar11->nSize <= (int)uVar6)) goto LAB_007b5bc1;
          pGVar3 = pGVar12->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + pGVar12->nObjs <= pGVar7)) goto LAB_007b5bff;
          iVar4 = pVVar11->pArray[uVar6 & 0x7fffffff];
          uVar16 = (int)((long)pGVar7 - (long)pGVar3 >> 2) * -0x55555555;
          pVVar11 = pGVar12->vLevels;
          Vec_IntFillExtra(pVVar11,uVar16 + 1,uVar6 & 0x7fffffff);
          if (((int)uVar16 < 0) || (pVVar11->nSize <= (int)uVar16)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar11->pArray[uVar16 & 0x7fffffff] = iVar4;
        }
      }
      else {
        uVar8 = *(ulong *)pGVar3 & 0x1fffffff;
        if (uVar8 == 0x1fffffff || -1 < (int)uVar6) {
          if (p->vMapping->nSize <= lVar17) {
LAB_007b5bc1:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->vMapping->pArray[lVar17] != 0) {
            p_01->vLeaves->nSize = 0;
            pVVar11 = p->vMapping;
            lVar9 = (long)pVVar11->nSize;
            if (lVar9 <= lVar17) goto LAB_007b5bc1;
            lVar19 = 0;
            while( true ) {
              piVar15 = pVVar11->pArray;
              lVar18 = (long)piVar15[lVar17];
              if ((lVar18 < 0) || ((int)lVar9 <= piVar15[lVar17])) goto LAB_007b5bc1;
              if (piVar15[lVar18] <= lVar19) break;
              Vec_IntPush(p_01->vLeaves,piVar15[lVar18 + lVar19 + 1]);
              lVar19 = lVar19 + 1;
              pVVar11 = p->vMapping;
              lVar9 = (long)pVVar11->nSize;
              if (lVar9 <= lVar17) goto LAB_007b5bc1;
            }
            if (6 < p_01->vLeaves->nSize) {
              __assert_fail("Vec_IntSize(pMan->vLeaves) <= 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                            ,0x1b0,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
            }
            wVar10 = Shr_ManComputeTruth6(p_01->pGia,pGVar3,p_01->vLeaves,p_01->vTruths);
            if (pGVar3->Value != 0xffffffff) {
              __assert_fail("pObj->Value == ~0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                            ,0x1b3,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
            }
            if (wVar10 + 1 < 2) {
              pGVar3->Value = (uint)(wVar10 == 0xffffffffffffffff);
            }
            else {
              lVar9 = (long)p_01->vLeaves->nSize;
              if (0 < lVar9) {
                piVar15 = p_01->vLeaves->pArray;
                lVar19 = 0;
                do {
                  iVar4 = *piVar15;
                  if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_007b5be0;
                  if (p->pObjs == (Gia_Obj_t *)0x0) break;
                  uVar8 = *(ulong *)((long)Truth + lVar19) ^ wVar10;
                  if (wVar10 == *(ulong *)((long)Truth + lVar19) || uVar8 == 0xffffffffffffffff) {
                    uVar6 = p->pObjs[iVar4].Value;
                    if ((int)uVar6 < 0) goto LAB_007b5d35;
                    pGVar3->Value = uVar6 ^ uVar8 == 0xffffffffffffffff;
                  }
                  piVar15 = piVar15 + 1;
                  lVar19 = lVar19 + 8;
                } while (lVar9 * 8 != lVar19);
              }
            }
            if (pGVar3->Value == 0xffffffff) {
              pVVar11 = p_01->vLeaves;
              if (0 < pVVar11->nSize) {
                piVar15 = pVVar11->pArray;
                pwVar22 = Truth;
                lVar9 = 0;
                do {
                  iVar4 = piVar15[lVar9];
                  if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_007b5be0;
                  if (p->pObjs == (Gia_Obj_t *)0x0) break;
                  uVar6 = p->pObjs[iVar4].Value;
                  if ((int)uVar6 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                  ,0x130,"int Abc_LitIsCompl(int)");
                  }
                  if ((uVar6 & 1) != 0) {
                    bVar13 = (byte)(1 << ((byte)lVar9 & 0x1f));
                    wVar10 = (~*pwVar22 & wVar10) << (bVar13 & 0x3f) |
                             (*pwVar22 & wVar10) >> (bVar13 & 0x3f);
                  }
                  piVar15[lVar9] = uVar6 >> 1;
                  lVar9 = lVar9 + 1;
                  pwVar22 = pwVar22 + 1;
                } while (lVar9 < pVVar11->nSize);
              }
              local_50 = wVar10;
              clock_gettime(3,&local_88);
              local_74 = p_01->nDivMax;
              if (local_74 < 7) {
                __assert_fail("Limit > 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                              ,0xe3,"int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                             );
              }
              pVVar11 = p_01->vLeaves;
              p_01->vDivs->nSize = 0;
              p_01->vPrio->nSize = 0;
              Gia_ManIncrementTravId(p_01->pNew);
              if (0 < pVVar11->nSize) {
                lVar9 = 0;
                do {
                  iVar4 = pVVar11->pArray[lVar9];
                  Vec_IntPush(p_01->vDivs,iVar4);
                  Shr_ManDivPushOrderByLevel(p_01,iVar4);
                  pGVar12 = p_01->pNew;
                  if (pGVar12->nTravIdsAlloc <= iVar4) {
LAB_007b5c9a:
                    __assert_fail("Id < p->nTravIdsAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                  ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
                  }
                  pGVar12->pTravIds[iVar4] = pGVar12->nTravIds;
                  lVar9 = lVar9 + 1;
                } while (lVar9 < pVVar11->nSize);
              }
              pVVar11 = p_01->vPrio;
              if (0 < pVVar11->nSize) {
                lVar9 = 0;
                do {
                  uVar6 = pVVar11->pArray[lVar9];
                  pGVar12 = p_01->pNew;
                  if (pGVar12->nTravIdsAlloc <= (int)uVar6) {
LAB_007b5c1e:
                    __assert_fail("Id < p->nTravIdsAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
                  }
                  if (pGVar12->pTravIds[(int)uVar6] != pGVar12->nTravIds) {
                    __assert_fail("Gia_ObjIsTravIdCurrentId(p->pNew, iDiv)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                                  ,0xf0,
                                  "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)");
                  }
                  if (((int)uVar6 < 0) || (p_01->vObj2Fan->nSize <= (int)uVar6)) goto LAB_007b5bc1;
                  uVar16 = p_01->vObj2Fan->pArray[uVar6];
                  local_58 = lVar9;
                  if ((ulong)uVar16 == 0) {
                    uVar8 = 0;
                  }
                  else {
                    if (((int)uVar16 < 0) || (p_01->vFanMem->nSize <= (int)uVar16)) {
LAB_007b5c3d:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                    }
                    pSVar1 = (Shr_Fan_t *)(p_01->vFanMem->pArray + uVar16);
                    p_01->pFanTemp = pSVar1;
                    uVar8 = (ulong)(uint)pSVar1->iFan;
                  }
                  if ((int)uVar8 != 0) {
                    local_70 = uVar6 + 1;
                    iVar4 = nFanoutMax + 1;
                    do {
                      iVar4 = iVar4 + -1;
                      if (iVar4 == 0) break;
                      pGVar12 = p_01->pNew;
                      iVar5 = (int)uVar8;
                      if (pGVar12->nTravIdsAlloc <= iVar5) goto LAB_007b5c1e;
                      lVar9 = (long)iVar5;
                      if (pGVar12->pTravIds[lVar9] != pGVar12->nTravIds) {
                        local_48 = lVar9;
                        if ((iVar5 < 0) || (pGVar12->nObjs <= iVar5)) goto LAB_007b5be0;
                        pGVar2 = pGVar12->pObjs;
                        uVar16 = (uint)*(undefined8 *)(pGVar2 + uVar8);
                        if (((int)uVar16 < 0) ||
                           (uVar16 = uVar16 & 0x1fffffff, uVar16 == 0x1fffffff)) {
                          __assert_fail("Gia_ObjIsAnd(pFan)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                                        ,0xf8,
                                        "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                       );
                        }
                        local_6c = iVar4;
                        if (pGVar12->nObjs <= (int)uVar6) goto LAB_007b5be0;
                        pVVar11 = pGVar12->vLevels;
                        Vec_IntFillExtra(pVVar11,local_70,uVar16);
                        if (pVVar11->nSize <= (int)uVar6) goto LAB_007b5bc1;
                        pGVar2 = pGVar2 + uVar8;
                        pGVar12 = p_01->pNew;
                        pGVar7 = pGVar12->pObjs;
                        if ((pGVar2 < pGVar7) || (pGVar7 + pGVar12->nObjs <= pGVar2))
                        goto LAB_007b5bff;
                        iVar21 = pVVar11->pArray[uVar6];
                        uVar16 = (int)((long)pGVar2 - (long)pGVar7 >> 2) * -0x55555555;
                        p_00 = pGVar12->vLevels;
                        Vec_IntFillExtra(p_00,uVar16 + 1,(int)pVVar11->pArray);
                        lVar9 = local_48;
                        iVar4 = local_6c;
                        if (((int)uVar16 < 0) || (p_00->nSize <= (int)uVar16)) goto LAB_007b5bc1;
                        if (p_00->pArray[uVar16 & 0x7fffffff] <= iVar21) {
                          __assert_fail("Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, iDiv)) < Gia_ObjLevel(p->pNew, pFan)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                                        ,0xf9,
                                        "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                       );
                        }
                        pGVar12 = p_01->pNew;
                        iVar21 = iVar5 - ((uint)*(undefined8 *)pGVar2 & 0x1fffffff);
                        if (pGVar12->nTravIdsAlloc <= iVar21) goto LAB_007b5c1e;
                        if (pGVar12->pTravIds[iVar21] == pGVar12->nTravIds) {
                          iVar21 = iVar5 - ((uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) &
                                           0x1fffffff);
                          if (pGVar12->nTravIdsAlloc <= iVar21) goto LAB_007b5c1e;
                          if (pGVar12->pTravIds[iVar21] == pGVar12->nTravIds) {
                            Vec_IntPush(p_01->vDivs,iVar5);
                            pGVar12 = p_01->pNew;
                            if (pGVar12->nTravIdsAlloc <= iVar5) goto LAB_007b5c9a;
                            pGVar12->pTravIds[lVar9] = pGVar12->nTravIds;
                            iVar5 = Shr_ManDivPushOrderByLevel(p_01,iVar5);
                            if (iVar5 <= local_58) {
                              __assert_fail("i < iPlace",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                                            ,0x100,
                                            "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                           );
                            }
                            iVar5 = p_01->vDivs->nSize;
                            if (iVar5 == local_74) goto LAB_007b5925;
                          }
                        }
                      }
                      uVar16 = p_01->pFanTemp->Next;
                      if ((ulong)uVar16 == 0) {
                        uVar8 = 0;
                      }
                      else {
                        if (((int)uVar16 < 0) || (p_01->vFanMem->nSize <= (int)uVar16))
                        goto LAB_007b5c3d;
                        pSVar1 = (Shr_Fan_t *)(p_01->vFanMem->pArray + uVar16);
                        p_01->pFanTemp = pSVar1;
                        uVar8 = (ulong)(uint)pSVar1->iFan;
                      }
                    } while ((int)uVar8 != 0);
                  }
                  lVar9 = local_58 + 1;
                  pVVar11 = p_01->vPrio;
                } while (lVar9 < pVVar11->nSize);
              }
              iVar5 = p_01->vDivs->nSize;
LAB_007b5925:
              if (p_01->nDivMax < iVar5) {
                __assert_fail("nDivs <= pMan->nDivMax",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                              ,0x1c6,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
              }
              clock_gettime(3,&local_88);
              Shr_ManComputeTruths
                        (p_01->pNew,p_01->vLeaves->nSize,p_01->vDivs,p_01->vDivTruths,p_01->vTruths)
              ;
              wVar10 = local_50;
              iVar4 = Rsb_ManPerformResub6
                                (p_01->pManRsb,p_01->vLeaves->nSize,local_50,p_01->vDivTruths,
                                 &local_38,&local_40,0);
              if (iVar4 == 0) {
                uVar6 = Shr_ObjPerformBidec(p_01,p_01->pManDec,p_01->pNew,p_01->vLeaves,wVar10,
                                            0xffffffffffffffff);
                pGVar3->Value = uVar6;
                local_b0 = local_b0 + 1;
                p = local_68;
              }
              else {
                pVVar11 = Rsb_ManGetFanins(p_01->pManRsb);
                p_01->vDivResub->nSize = 0;
                if (0 < pVVar11->nSize) {
                  lVar9 = 0;
                  do {
                    iVar4 = pVVar11->pArray[lVar9];
                    if (((long)iVar4 < 0) || (p_01->vDivs->nSize <= iVar4)) goto LAB_007b5bc1;
                    Vec_IntPush(p_01->vDivResub,p_01->vDivs->pArray[iVar4]);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < pVVar11->nSize);
                }
                uVar6 = Shr_ObjPerformBidec(p_01,p_01->pManDec,p_01->pNew,p_01->vDivResub,local_40,
                                            local_38 | local_40);
                pGVar3->Value = uVar6;
                local_ac = local_ac + 1;
                p = local_68;
              }
            }
          }
        }
        else {
          uVar16 = pGVar3[-uVar8].Value;
          if ((int)uVar16 < 0) {
LAB_007b5d35:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar12 = p_01->pNew;
          uVar20 = uVar16 >> 1;
          if (pGVar12->nObjs <= (int)uVar20) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(pGVar12->pObjs + uVar20) & 0x1fffffff) != 0 &&
              (int)*(uint *)(pGVar12->pObjs + uVar20) < 0) {
            __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          pGVar7 = Gia_ManAppendObj(pGVar12);
          uVar8 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar8 | 0x80000000;
          pGVar2 = pGVar12->pObjs;
          if ((pGVar7 < pGVar2) || (pGVar2 + pGVar12->nObjs <= pGVar7)) goto LAB_007b5bff;
          uVar14 = (ulong)(((uint)((int)pGVar7 - (int)pGVar2) >> 2) * -0x55555555 - uVar20 &
                          0x1fffffff);
          uVar23 = (ulong)((uVar16 << 0x1d ^ uVar6) & 0x20000000);
          *(ulong *)pGVar7 = uVar23 | uVar8 & 0xffffffffc0000000 | 0x80000000 | uVar14;
          *(ulong *)pGVar7 =
               uVar23 | uVar8 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
               (ulong)(pGVar12->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar2 = pGVar12->pObjs;
          if ((pGVar7 < pGVar2) || (pGVar2 + pGVar12->nObjs <= pGVar7)) goto LAB_007b5bff;
          Vec_IntPush(pGVar12->vCos,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
          if (pGVar12->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(pGVar12,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff),
                             pGVar7);
          }
          pGVar2 = pGVar12->pObjs;
          if ((pGVar7 < pGVar2) || (pGVar2 + pGVar12->nObjs <= pGVar7)) goto LAB_007b5bff;
          pGVar3->Value = (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * 0x55555556;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < p->nObjs);
  }
  if (local_78 != 0) {
    printf("Performed %d resubs and %d decomps.  ",(ulong)local_ac,(ulong)local_b0);
    iVar4 = 0xa35c5d;
    printf("Gain in AIG nodes = %d.  ",(ulong)(uint)(p->nObjs - p_01->pNew->nObjs));
    Abc_Print(iVar4,"%s =","Runtime");
    iVar5 = 3;
    iVar4 = clock_gettime(3,&local_88);
    if (iVar4 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar17 + local_60) / 1000000.0);
  }
  pGVar12 = Shr_ManFree(p_01);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManMapShrink6( Gia_Man_t * p, int nFanoutMax, int fKeepLevel, int fVerbose )
{
    Shr_Man_t * pMan;
    Gia_Obj_t * pObj, * pFanin;
    word uTruth, uTruth0, uTruth1;
    int i, k, nDivs, iNode;
    int RetValue, Counter1 = 0, Counter2 = 0;
    abctime clk2, clk = Abc_Clock();
    abctime timeFanout = 0;
    assert( Gia_ManHasMapping(p) );
    pMan = Shr_ManAlloc( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pMan->pNew );
            if ( p->vLevels )
                Gia_ObjSetLevel( pMan->pNew, Gia_ObjFromLit(pMan->pNew, Gia_ObjValue(pObj)), Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ManAppendCo( pMan->pNew, Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsLut(p, i) )
        {
            // collect leaves of this gate  
            Vec_IntClear( pMan->vLeaves );
            Gia_LutForEachFanin( p, i, iNode, k )
                Vec_IntPush( pMan->vLeaves, iNode );
            assert( Vec_IntSize(pMan->vLeaves) <= 6 );
            // compute truth table 
            uTruth = Shr_ManComputeTruth6( pMan->pGia, pObj, pMan->vLeaves, pMan->vTruths );
            assert( pObj->Value == ~0 );
            if ( uTruth == 0 || ~uTruth == 0 )
                pObj->Value = Abc_LitNotCond( 0, ~uTruth == 0 );
            else
                Gia_ManForEachObjVec( pMan->vLeaves, p, pFanin, k )
                    if ( uTruth == Truth[k] || ~uTruth == Truth[k] )
                        pObj->Value = Abc_LitNotCond( pFanin->Value, ~uTruth == Truth[k] );
            if ( pObj->Value != ~0 )
                continue;
            // translate into new nodes
            Gia_ManForEachObjVec( pMan->vLeaves, p, pFanin, k )
            {
                if ( Abc_LitIsCompl(pFanin->Value) )
                    uTruth = ((uTruth & Truth[k]) >> (1 << k)) | ((uTruth & ~Truth[k]) << (1 << k));
                Vec_IntWriteEntry( pMan->vLeaves, k, Abc_Lit2Var(pFanin->Value) );
            }
            // compute divisors
            clk2 = Abc_Clock();
            nDivs = Shr_ManCollectDivisors( pMan, pMan->vLeaves, pMan->nDivMax, nFanoutMax );
            assert( nDivs <= pMan->nDivMax );
            timeFanout += Abc_Clock() - clk2;
            // compute truth tables
            Shr_ManComputeTruths( pMan->pNew, Vec_IntSize(pMan->vLeaves), pMan->vDivs, pMan->vDivTruths, pMan->vTruths );
            // perform resubstitution
            RetValue = Rsb_ManPerformResub6( pMan->pManRsb, Vec_IntSize(pMan->vLeaves), uTruth, pMan->vDivTruths, &uTruth0, &uTruth1, 0 );
            if ( RetValue ) // resub exists
            {
                Vec_Int_t * vResult = Rsb_ManGetFanins(pMan->pManRsb);
                Vec_IntClear( pMan->vDivResub );
                Vec_IntForEachEntry( vResult, iNode, k )
                    Vec_IntPush( pMan->vDivResub, Vec_IntEntry(pMan->vDivs, iNode) );
                pObj->Value = Shr_ObjPerformBidec( pMan, pMan->pManDec, pMan->pNew, pMan->vDivResub, uTruth1, uTruth0 | uTruth1 );
                Counter1++;
            }
            else
            {
                pObj->Value = Shr_ObjPerformBidec( pMan, pMan->pManDec, pMan->pNew, pMan->vLeaves, uTruth, ~(word)0 );
                Counter2++;
            }
        }
    }
    if ( fVerbose )
    {
        printf( "Performed %d resubs and %d decomps.  ", Counter1, Counter2 );
        printf( "Gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pMan->pNew) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
//        ABC_PRT( "Divisors", timeFanout );        
    }
    return Shr_ManFree( pMan );
}